

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derOIDEnc(octet *der,char *oid)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  bool_t bVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  octet *poVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  char *pcVar14;
  
  bVar4 = oidIsValid(oid);
  if (bVar4 != 0) {
    iVar8 = *oid + -0x30;
    pcVar13 = oid + 2;
    sVar7 = 0;
    do {
      iVar5 = 0;
      pcVar14 = pcVar13;
      while( true ) {
        pcVar13 = pcVar14 + 1;
        cVar1 = *pcVar14;
        if ((cVar1 == '.') || (cVar1 == '\0')) break;
        iVar5 = (int)cVar1 + iVar5 * 10 + -0x30;
        pcVar14 = pcVar13;
      }
      iVar3 = iVar8 * 0x28;
      if (iVar8 == 3) {
        iVar3 = 0;
      }
      poVar10 = der + sVar7;
      if (der == (octet *)0x0) {
        poVar10 = (octet *)0x0;
      }
      uVar9 = iVar3 + iVar5;
      if (uVar9 == 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = 0;
        uVar12 = uVar9;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = 0x7f < uVar12;
          uVar12 = uVar12 >> 7;
        } while (bVar2);
      }
      if (poVar10 != (octet *)0x0) {
        poVar10[lVar6 + -1] = (byte)uVar9 & 0x7f;
        for (lVar11 = lVar6; lVar11 != 1; lVar11 = lVar11 + -1) {
          uVar9 = uVar9 >> 7;
          poVar10[lVar11 + -2] = (byte)uVar9 | 0x80;
        }
      }
      sVar7 = lVar6 + sVar7;
      iVar8 = 3;
    } while (*pcVar14 != '\0');
    sVar7 = derEnc(der,6,der,sVar7);
    return sVar7;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t derOIDEnc(octet der[], const char* oid)
{
	u32 d1;
	u32 val = 0;
	size_t pos = 0;
	size_t count = 0;
	// корректен?
	if (!oidIsValid(oid))
		return SIZE_MAX;
	// pre
	ASSERT(oid[0] == '0' || oid[0] == '1' || oid[0] == '2');
	ASSERT(oid[1] == '.');
	// обработать d1
	d1 = oid[0] - '0';
	oid += 2;
	// цикл по символам oid
	while (1)
	{
		// закончили очередное число?
		if (oid[pos] == '.' || oid[pos] == '\0')
		{
			// закончили d2?
			if (d1 != 3)
				val += 40 * d1, d1 = 3;
			// обработать число
			count += derSIDEnc(der ? der + count : der, val);
			// конец строки?
			if (oid[pos] == '\0')
				break;
			// к следующему числу
			oid += ++pos, pos = 0, val = 0;
				continue;
		}
		// обработать цифру
		val *= 10;
		val += oid[pos] - '0';
		++pos;
	}
	// кодировать TL
	count = derEnc(der, 0x06, der, count);
	// очистка и выход
	d1 = val = 0, pos = 0;
	return count;
}